

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O3

uint Extra_TruthCanonNPN(uint uTruth,int nVars)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar19;
  uint uVar20;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  int local_38;
  
  if (Extra_TruthCanonNPN::pPerms == (char **)0x0) {
    if (0 < nVars) {
      auVar16 = _DAT_008c1c20;
      iVar1 = 4;
      uVar8 = 1;
      uVar2 = 1;
      uVar3 = 1;
      uVar10 = 1;
      do {
        uVar14 = uVar10;
        uVar13 = uVar3;
        uVar12 = uVar2;
        uVar11 = uVar8;
        uVar8 = auVar16._0_4_ * uVar11;
        uVar3 = (uint)((auVar16._8_8_ & 0xffffffff) * (ulong)uVar13);
        uVar2 = auVar16._4_4_ * uVar12;
        uVar10 = auVar16._12_4_ * uVar14;
        auVar18._0_4_ = auVar16._0_4_ + 4;
        auVar18._4_4_ = auVar16._4_4_ + 4;
        auVar18._8_4_ = auVar16._8_4_ + 4;
        auVar18._12_4_ = auVar16._12_4_ + 4;
        iVar4 = iVar1 + -4;
        iVar6 = iVar1 + (nVars + 3U & 0xfffffffc);
        auVar16 = auVar18;
        iVar1 = iVar4;
      } while (iVar6 != 8);
      goto LAB_00418964;
    }
LAB_004189b8:
    Extra_TruthCanonNPN::nPerms = 1;
  }
  else {
    if (Extra_TruthCanonNPN::nVarsOld == nVars) goto LAB_004189d7;
    free(Extra_TruthCanonNPN::pPerms);
    Extra_TruthCanonNPN::pPerms = (char **)0x0;
    if (nVars < 1) goto LAB_004189b8;
    auVar16 = _DAT_008c1c20;
    iVar1 = 4;
    uVar8 = 1;
    uVar2 = 1;
    uVar3 = 1;
    uVar10 = 1;
    do {
      uVar14 = uVar10;
      uVar13 = uVar3;
      uVar12 = uVar2;
      uVar11 = uVar8;
      uVar8 = auVar16._0_4_ * uVar11;
      uVar3 = (uint)((auVar16._8_8_ & 0xffffffff) * (ulong)uVar13);
      uVar2 = auVar16._4_4_ * uVar12;
      uVar10 = auVar16._12_4_ * uVar14;
      auVar17._0_4_ = auVar16._0_4_ + 4;
      auVar17._4_4_ = auVar16._4_4_ + 4;
      auVar17._8_4_ = auVar16._8_4_ + 4;
      auVar17._12_4_ = auVar16._12_4_ + 4;
      iVar4 = iVar1 + -4;
      iVar6 = iVar1 + (nVars + 3U & 0xfffffffc);
      auVar16 = auVar17;
      iVar1 = iVar4;
    } while (iVar6 != 8);
LAB_00418964:
    uVar9 = nVars - 1;
    uVar5 = -iVar4;
    uVar15 = -(uint)((int)(uVar9 ^ 0x80000000) < (int)(uVar5 ^ 0x80000000));
    uVar19 = -(uint)((int)(nVars - 1U ^ 0x80000000) < (int)((uVar5 | 1) ^ 0x80000000));
    uVar20 = -(uint)((int)(uVar9 ^ 0x80000000) < (int)((uVar5 | 2) ^ 0x80000000));
    uVar5 = -(uint)((int)(uVar9 ^ 0x80000000) < (int)((uVar5 | 3) ^ 0x80000000));
    Extra_TruthCanonNPN::nPerms =
         (~uVar20 & uVar3 | uVar13 & uVar20) * (~uVar15 & uVar8 | uVar11 & uVar15) *
         (~uVar19 & uVar2 | uVar12 & uVar19) * (~uVar5 & uVar10 | uVar14 & uVar5);
  }
  Extra_TruthCanonNPN::pPerms = Extra_Permutations(nVars);
  Extra_TruthCanonNPN::nVarsOld = nVars;
LAB_004189d7:
  iVar1 = 1 << ((byte)nVars & 0x1f);
  uVar8 = 0xffffffff;
  if (nVars != 0x1f) {
    local_38 = 1;
    if (1 < iVar1) {
      local_38 = iVar1;
    }
    iVar4 = 0;
    do {
      uVar2 = Extra_TruthPolarize(uTruth,iVar4,nVars);
      if (0 < Extra_TruthCanonNPN::nPerms) {
        lVar7 = 0;
        do {
          uVar3 = Extra_TruthPermute(uVar2,Extra_TruthCanonNPN::pPerms[lVar7],nVars,0);
          if (uVar3 <= uVar8) {
            uVar8 = uVar3;
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 < Extra_TruthCanonNPN::nPerms);
      }
      uVar2 = Extra_TruthPolarize((~uTruth << (-(char)iVar1 & 0x1fU)) >> (-(char)iVar1 & 0x1fU),
                                  iVar4,nVars);
      if (0 < Extra_TruthCanonNPN::nPerms) {
        lVar7 = 0;
        do {
          uVar3 = Extra_TruthPermute(uVar2,Extra_TruthCanonNPN::pPerms[lVar7],nVars,0);
          if (uVar3 <= uVar8) {
            uVar8 = uVar3;
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 < Extra_TruthCanonNPN::nPerms);
      }
      iVar4 = iVar4 + 1;
    } while (iVar4 != local_38);
  }
  return uVar8;
}

Assistant:

unsigned Extra_TruthCanonNPN( unsigned uTruth, int nVars )
{
    static int nVarsOld, nPerms;
    static char ** pPerms = NULL;

    unsigned uTruthMin, uTruthC, uPhase, uPerm;
    int nMints, k, i;

    if ( pPerms == NULL )
    {
        nPerms = Extra_Factorial( nVars );   
        pPerms = Extra_Permutations( nVars );
        nVarsOld = nVars;
    }
    else if ( nVarsOld != nVars )
    {
        ABC_FREE( pPerms );
        nPerms = Extra_Factorial( nVars );   
        pPerms = Extra_Permutations( nVars );
        nVarsOld = nVars;
    }

    nMints    = (1 << nVars);
    uTruthC   = (unsigned)( (~uTruth) & ((~((unsigned)0)) >> (32-nMints)) );
    uTruthMin = 0xFFFFFFFF;
    for ( i = 0; i < nMints; i++ )
    {
        uPhase = Extra_TruthPolarize( uTruth, i, nVars ); 
        for ( k = 0; k < nPerms; k++ )
        {
            uPerm = Extra_TruthPermute( uPhase, pPerms[k], nVars, 0 );
            if ( uTruthMin > uPerm )
                uTruthMin = uPerm;
        }
        uPhase = Extra_TruthPolarize( uTruthC, i, nVars ); 
        for ( k = 0; k < nPerms; k++ )
        {
            uPerm = Extra_TruthPermute( uPhase, pPerms[k], nVars, 0 );
            if ( uTruthMin > uPerm )
                uTruthMin = uPerm;
        }
    }
    return uTruthMin;
}